

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EveryHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  RecyclableObject *callBackFn;
  ulong uVar5;
  undefined8 uVar6;
  JavascriptMethod p_Var7;
  long lVar8;
  undefined4 *puVar9;
  char16_t *varName;
  uint32 nValue;
  uint32 local_78;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_48;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a63f6b:
    varName = L"[TypedArray].prototype.every";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.every";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar4 = Arguments::operator[](args,1);
  bVar2 = JavascriptConversion::IsCallable(pvVar4);
  if (!bVar2) goto LAB_00a63f6b;
  pvVar4 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar4);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_48 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_48 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar2 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar2) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
      goto LAB_00a63def;
    }
  }
  else {
LAB_00a63def:
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      bVar2 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
      if (!bVar2) {
        bVar2 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x22f7,"(VarIsCorrectType(typedArrayBase))",
                                      "VarIsCorrectType(typedArrayBase)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar9 = 0;
        }
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar5 = (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
      if (uVar5 < length) {
        length = uVar5;
      }
      nValue = 0;
      jsReentLock._24_8_ = typedArrayBase;
      do {
        local_78 = (uint32)length;
        if (local_78 == nValue) {
          lVar8 = 1000;
          goto LAB_00a63f43;
        }
        uVar6 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))(jsReentLock._24_8_,nValue);
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        this = scriptContext->threadContext;
        bVar2 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var7);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        pvVar4 = JavascriptNumber::ToVar(nValue,scriptContext);
        pvVar4 = (*p_Var7)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_48,
                           uVar6,pvVar4,jsReentLock._24_8_);
        this->reentrancySafeOrHandled = bVar2;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        BVar3 = JavascriptConversion::ToBoolean(pvVar4,scriptContext);
        nValue = nValue + 1;
      } while (BVar3 != 0);
      lVar8 = 0x3f0;
LAB_00a63f43:
      pvVar4 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                               super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar8);
      goto LAB_00a63f4f;
    }
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar4 = EveryObjectHelper<unsigned_long>(obj,length,0,callBackFn,local_48,scriptContext);
LAB_00a63f4f:
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar4;
}

Assistant:

Var JavascriptArray::EveryHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.every"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.every"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;


        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;
        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (!JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetFalse();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::EveryObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetTrue();
    }